

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfd::ConfidentialTransactionContext::SignWithPrivkeySimple
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,ConfidentialValue *value,AddressType address_type,
          bool has_grind_r)

{
  WitnessVersion WVar1;
  Privkey *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  SigHashType *in_R8;
  undefined8 in_R9;
  byte in_stack_00000010;
  SignParameter sign;
  ByteData signature;
  ByteData sighash;
  WitnessVersion version;
  SignParameter *in_stack_fffffffffffffea0;
  AddressType address_type_00;
  SigHashType *this_00;
  SignParameter *signature_00;
  OutPoint *in_stack_fffffffffffffed8;
  ConfidentialTransactionContext *in_stack_fffffffffffffee0;
  ByteData256 local_90;
  AddressType in_stack_ffffffffffffff9c;
  Privkey *in_stack_ffffffffffffffa0;
  Pubkey *in_stack_ffffffffffffffa8;
  OutPoint *in_stack_ffffffffffffffb0;
  
  WVar1 = TransactionContextUtil::CheckSignWithPrivkeySimple
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff9c);
  this_00 = (SigHashType *)&stack0xffffffffffffffa4;
  core::SigHashType::SigHashType(this_00,in_R8);
  signature_00 = (SignParameter *)&stack0xffffffffffffffb0;
  (**(code **)(*in_RDI + 0xb0))(signature_00,in_RDI,in_RSI,in_RDX,this_00,in_R9,WVar1);
  address_type_00 = (AddressType)((ulong)in_RDX >> 0x20);
  core::ByteData256::ByteData256(&local_90,&signature_00->data_);
  core::SignatureUtil::CalculateEcSignature
            ((ByteData *)&stack0xffffffffffffff88,&local_90,in_RCX,(bool)(in_stack_00000010 & 1),
             false);
  core::ByteData256::~ByteData256((ByteData256 *)0x58127e);
  core::SigHashType::SigHashType((SigHashType *)&stack0xfffffffffffffedc,in_R8);
  SignParameter::SignParameter
            ((SignParameter *)in_stack_fffffffffffffee0,(ByteData *)in_stack_fffffffffffffed8,
             SUB81((ulong)signature_00 >> 0x38,0),this_00);
  AddPubkeyHashSign(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,signature_00,
                    (Pubkey *)this_00,address_type_00);
  SignParameter::~SignParameter(in_stack_fffffffffffffea0);
  core::ByteData::~ByteData((ByteData *)0x5812ed);
  core::ByteData::~ByteData((ByteData *)0x5812fa);
  return;
}

Assistant:

void ConfidentialTransactionContext::SignWithPrivkeySimple(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, const ConfidentialValue& value,
    AddressType address_type, bool has_grind_r) {
  WitnessVersion version = TransactionContextUtil::CheckSignWithPrivkeySimple(
      outpoint, pubkey, privkey, address_type);

  ByteData sighash =
      CreateSignatureHash(outpoint, pubkey, sighash_type, value, version);
  ByteData signature = SignatureUtil::CalculateEcSignature(
      ByteData256(sighash), privkey, has_grind_r);
  SignParameter sign(signature, true, sighash_type);

  AddPubkeyHashSign(outpoint, sign, pubkey, address_type);
}